

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

Symbol * __thiscall
slang::ast::SpecparamSymbol::resolvePathTerminal
          (SpecparamSymbol *this,string_view terminalName,Scope *parent,SourceLocation loc,
          bool isSource)

{
  string_view arg;
  SourceRange sourceRange_00;
  bool bVar1;
  Symbol *pSVar2;
  SourceLocation SVar3;
  SourceLocation terminal;
  Scope *in_RCX;
  uint32_t uVar4;
  char *in_RSI;
  SourceLocation in_R8;
  byte in_R9B;
  LookupLocation LVar5;
  Scope *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  DiagCode in_stack_00000024;
  ValueSymbol *value;
  SpecifyTerminalDir dir;
  Diagnostic *diag;
  DiagCode code;
  Symbol *symbol;
  SourceRange sourceRange;
  Scope *parentParent;
  Scope *in_stack_00000218;
  bitmask<slang::ast::LookupFlags> in_stack_00000224;
  LookupLocation in_stack_00000228;
  string_view in_stack_00000238;
  SourceRange in_stack_00000260;
  Symbol *in_stack_fffffffffffffed0;
  SourceLocation in_stack_fffffffffffffed8;
  DiagCode noteCode;
  Diagnostic *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  bitmask<slang::ast::LookupFlags> in_stack_ffffffffffffff54;
  SourceLocation type;
  undefined4 in_stack_ffffffffffffff74;
  SourceLocation SVar6;
  SourceRange local_50;
  Scope *local_40;
  byte local_31;
  Scope *local_30;
  SourceLocation local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  Symbol *local_8;
  
  local_31 = in_R9B & 1;
  local_30 = in_RCX;
  local_20 = in_R8;
  local_18._M_len = (size_t)in_RSI;
  pSVar2 = Scope::asSymbol(in_RCX);
  local_40 = Symbol::getParentScope(pSVar2);
  std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  SVar3 = SourceLocation::operator+<unsigned_long>
                    ((SourceLocation *)in_stack_fffffffffffffed8,
                     (unsigned_long)in_stack_fffffffffffffed0);
  SourceRange::SourceRange(&local_50,local_20,SVar3);
  Scope::asSymbol(local_30);
  LVar5 = LookupLocation::after(in_stack_fffffffffffffed0);
  terminal = (SourceLocation)LVar5.scope;
  uVar4 = LVar5.index;
  SVar3 = local_50.endLoc;
  SVar6 = terminal;
  bitmask<slang::ast::LookupFlags>::bitmask
            ((bitmask<slang::ast::LookupFlags> *)&stack0xffffffffffffff54,NoParentScope);
  type = SVar3;
  pSVar2 = Lookup::unqualifiedAt
                     (in_stack_00000218,in_stack_00000238,in_stack_00000228,in_stack_00000260,
                      in_stack_00000224);
  if (pSVar2 == (Symbol *)0x0) {
    local_8 = (Symbol *)0x0;
  }
  else {
    bVar1 = Symbol::isValue((Symbol *)0x763b78);
    if (bVar1) {
      Symbol::as<slang::ast::ValueSymbol>((Symbol *)0x763c8f);
      ValueSymbol::getType((ValueSymbol *)0x763ca8);
      sourceRange_00.startLoc._4_4_ = in_stack_ffffffffffffff74;
      sourceRange_00.startLoc._0_4_ = uVar4;
      sourceRange_00.endLoc = SVar6;
      bVar1 = SpecifyBlockSymbol::checkPathTerminal
                        ((ValueSymbol *)terminal,(Type *)type,(Scope *)local_50.startLoc,
                         in_stack_ffffffffffffff54.m_bits,sourceRange_00);
      local_8 = pSVar2;
      if (!bVar1) {
        local_8 = (Symbol *)0x0;
      }
    }
    else {
      noteCode.subsystem = Invalid;
      noteCode.code = 0;
      Scope::addDiag(in_stack_00000008,in_stack_00000024,(SourceRange)in_stack_00000010);
      arg._M_len._4_4_ = in_stack_ffffffffffffff1c;
      arg._M_len._0_4_ = in_stack_ffffffffffffff18;
      arg._M_str = (char *)local_18._M_len;
      Diagnostic::operator<<(in_stack_ffffffffffffff10,arg);
      Diagnostic::addNote((Diagnostic *)SVar3,noteCode,in_stack_fffffffffffffed8);
      local_8 = (Symbol *)0x0;
    }
  }
  return local_8;
}

Assistant:

const Symbol* SpecparamSymbol::resolvePathTerminal(std::string_view terminalName,
                                                   const Scope& parent, SourceLocation loc,
                                                   bool isSource) const {
    auto parentParent = parent.asSymbol().getParentScope();
    SLANG_ASSERT(parentParent);

    SourceRange sourceRange{loc, loc + terminalName.length()};
    auto symbol = Lookup::unqualifiedAt(*parentParent, terminalName,
                                        LookupLocation::after(parent.asSymbol()), sourceRange,
                                        LookupFlags::NoParentScope);
    if (!symbol)
        return nullptr;

    if (!symbol->isValue()) {
        auto code = isSource ? diag::InvalidSpecifySource : diag::InvalidSpecifyDest;
        auto& diag = parent.addDiag(code, sourceRange) << terminalName;
        diag.addNote(diag::NoteDeclarationHere, symbol->location);
        return nullptr;
    }

    auto dir = isSource ? SpecifyBlockSymbol::SpecifyTerminalDir::Input
                        : SpecifyBlockSymbol::SpecifyTerminalDir::Output;
    auto& value = symbol->as<ValueSymbol>();
    if (!SpecifyBlockSymbol::checkPathTerminal(value, value.getType(), *parentParent, dir,
                                               sourceRange)) {
        return nullptr;
    }

    return symbol;
}